

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EulerAngles.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::EulerAngles::Decode(EulerAngles *this,KDataStream *stream)

{
  KException *this_00;
  KUINT16 KVar1;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0xb < KVar1) {
    KDataStream::Read<float>(stream,(float *)&this->m_f32Psi);
    KDataStream::Read<float>(stream,(float *)&this->m_f32Theta);
    KDataStream::Read<float>(stream,(float *)&this->m_f32Phi);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void EulerAngles::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < EULER_ANGLES_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_f32Psi
           >> m_f32Theta
           >> m_f32Phi;
}